

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeT2LoadImm12(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  DecodeStatus DVar3;
  uint64_t uVar4;
  uint64_t Address_00;
  uint64_t extraout_RDX;
  uint64_t uVar5;
  uint64_t Address_01;
  uint RegNo;
  uint uVar6;
  
  uVar6 = Insn >> 0x10 & 0xf;
  uVar4 = ARM_getFeatureBits(Inst->csh->mode);
  if (uVar6 == 0xf) {
    uVar6 = MCInst_getOpcode(Inst);
    if (uVar6 == 0x94d) {
      uVar6 = 0x94f;
    }
    else if (uVar6 == 0x9bb) {
      uVar6 = 0x9bd;
    }
    else if (uVar6 == 0x964) {
      uVar6 = 0x966;
    }
    else if (uVar6 == 0x96c) {
      uVar6 = 0x96e;
    }
    else if (uVar6 == 0x974) {
      uVar6 = 0x976;
    }
    else if (uVar6 == 0x9b7) {
      uVar6 = 0x9b9;
    }
    else {
      if (uVar6 != 0x95c) {
        return MCDisassembler_Fail;
      }
      uVar6 = 0x95e;
    }
    MCInst_setOpcode(Inst,uVar6);
    DVar3 = DecodeT2LoadLabel(Inst,Insn,Address_01,Decoder);
    return DVar3;
  }
  RegNo = Insn >> 0xc & 0xf;
  if (RegNo == 0xf) {
    uVar1 = MCInst_getOpcode(Inst);
    if (uVar1 == 0x95c) {
      uVar1 = 0x9b4;
    }
    else {
      if (uVar1 == 0x96c) {
        return MCDisassembler_Fail;
      }
      if (uVar1 != 0x964) goto LAB_001c1ab7;
      uVar1 = 0x9bb;
    }
    MCInst_setOpcode(Inst,uVar1);
  }
LAB_001c1ab7:
  uVar1 = MCInst_getOpcode(Inst);
  DVar3 = MCDisassembler_Success;
  uVar5 = Address_00;
  if (uVar1 == 0x9b4) {
    if ((~uVar4 & 0x10000008000) != 0) {
      return MCDisassembler_Fail;
    }
  }
  else if (uVar1 != 0x9b7) {
    if (uVar1 == 0x9bb) {
      if ((uVar4 & 0x10000000000) == 0) {
        return MCDisassembler_Fail;
      }
    }
    else {
      DVar3 = DecodeGPRRegisterClass(Inst,RegNo,Address_00,Decoder);
      uVar5 = extraout_RDX;
      if ((DVar3 | 2) != MCDisassembler_Success) {
        return MCDisassembler_Fail;
      }
    }
  }
  DVar2 = DecodeT2AddrModeImm12(Inst,uVar6 << 0xd | Insn & 0xfff,uVar5,Decoder);
  if (DVar2 == MCDisassembler_Fail) {
    return MCDisassembler_Fail;
  }
  if (DVar2 == MCDisassembler_Success) {
    return DVar3;
  }
  if (DVar2 != MCDisassembler_SoftFail) {
    return MCDisassembler_Fail;
  }
  return MCDisassembler_SoftFail;
}

Assistant:

static DecodeStatus DecodeT2LoadImm12(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void* Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 12);
	uint64_t featureBits = ARM_getFeatureBits(Inst->csh->mode);
	bool hasMP = ((featureBits & ARM_FeatureMP) != 0);
	bool hasV7Ops = ((featureBits & ARM_HasV7Ops) != 0);

	imm |= (Rn << 13);

	if (Rn == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRi12:
				MCInst_setOpcode(Inst, ARM_t2LDRpci);
				break;
			case ARM_t2LDRHi12:
				MCInst_setOpcode(Inst, ARM_t2LDRHpci);
				break;
			case ARM_t2LDRSHi12:
				MCInst_setOpcode(Inst, ARM_t2LDRSHpci);
				break;
			case ARM_t2LDRBi12:
				MCInst_setOpcode(Inst, ARM_t2LDRBpci);
				break;
			case ARM_t2LDRSBi12:
				MCInst_setOpcode(Inst, ARM_t2LDRSBpci);
				break;
			case ARM_t2PLDi12:
				MCInst_setOpcode(Inst, ARM_t2PLDpci);
				break;
			case ARM_t2PLIi12:
				MCInst_setOpcode(Inst, ARM_t2PLIpci);
				break;
			default:
				return MCDisassembler_Fail;
		}
		return DecodeT2LoadLabel(Inst, Insn, Address, Decoder);
	}

	if (Rt == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRSHi12:
				return MCDisassembler_Fail;
			case ARM_t2LDRHi12:
				MCInst_setOpcode(Inst, ARM_t2PLDWi12);
				break;
			case ARM_t2LDRSBi12:
				MCInst_setOpcode(Inst, ARM_t2PLIi12);
				break;
			default:
				break;
		}
	}

	switch (MCInst_getOpcode(Inst)) {
		case ARM_t2PLDi12:
			break;
		case ARM_t2PLIi12:
			if (!hasV7Ops)
				return MCDisassembler_Fail;
			break;
		case ARM_t2PLDWi12:
			if (!hasV7Ops || !hasMP)
				return MCDisassembler_Fail;
			break;
		default:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
				return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeT2AddrModeImm12(Inst, imm, Address, Decoder)))
		return MCDisassembler_Fail;
	return S;
}